

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::DescriptorPool::Tables::RollbackToLastCheckpoint(Tables *this)

{
  size_type *psVar1;
  pointer *ppCVar2;
  char *__s1;
  _Node **pp_Var3;
  pointer ppMVar4;
  pointer ppvVar5;
  pointer pCVar6;
  Tables *pTVar7;
  int iVar8;
  LogMessage *other;
  ulong uVar9;
  char cVar10;
  char *pcVar11;
  pointer ppcVar12;
  pointer ppVar13;
  _Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
  **pp_Var14;
  _Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
  **pp_Var15;
  long lVar16;
  ulong uVar17;
  _Node *__p;
  _Node *p_Var18;
  _Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
  *p_Var19;
  pointer ppMVar20;
  _Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
  **pp_Var21;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
  pVar22;
  LogFinisher local_81;
  pointer local_80;
  Tables *local_78;
  vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  *local_70;
  LogMessage local_68;
  
  local_80 = (this->checkpoints_).
             super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->checkpoints_).
      super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
      ._M_impl.super__Vector_impl_data._M_start == local_80) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x250);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: !checkpoints_.empty(): ");
    internal::LogFinisher::operator=(&local_81,other);
    internal::LogMessage::~LogMessage(&local_68);
    local_80 = (this->checkpoints_).
               super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  uVar17 = (ulong)local_80[-1].pending_symbols_before_checkpoint;
  ppcVar12 = (this->symbols_after_checkpoint_).
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  pTVar7 = this;
  if (uVar17 < (ulong)((long)(this->symbols_after_checkpoint_).
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppcVar12 >> 3)) {
    do {
      local_78 = pTVar7;
      __s1 = ppcVar12[uVar17];
      cVar10 = *__s1;
      if (cVar10 == '\0') {
        uVar9 = 0;
      }
      else {
        uVar9 = 0;
        pcVar11 = __s1;
        do {
          pcVar11 = pcVar11 + 1;
          uVar9 = (long)cVar10 + uVar9 * 5;
          cVar10 = *pcVar11;
        } while (cVar10 != '\0');
      }
      uVar9 = uVar9 % (local_78->symbols_by_name_).
                      super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                      .
                      super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                      .
                      super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                      ._M_bucket_count;
      pp_Var3 = (local_78->symbols_by_name_).
                super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_buckets;
      p_Var19 = pp_Var3[uVar9];
      if (p_Var19 != (_Node *)0x0) {
        iVar8 = strcmp(__s1,(p_Var19->_M_v).first);
        if (iVar8 == 0) {
          pp_Var14 = pp_Var3 + uVar9;
        }
        else {
          do {
            p_Var18 = p_Var19;
            p_Var19 = p_Var18->_M_next;
            if (p_Var19 ==
                (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
                 *)0x0) goto LAB_001c94a2;
            iVar8 = strcmp(__s1,(p_Var19->_M_v).first);
          } while (iVar8 != 0);
          pp_Var14 = &p_Var18->_M_next;
        }
        pTVar7 = local_78;
        pp_Var21 = (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
                    **)0x0;
        do {
          iVar8 = strcmp((((_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
                            *)(ppcVar12 + uVar17))->_M_v).first,(p_Var19->_M_v).first);
          if (iVar8 != 0) break;
          if (p_Var19 ==
              (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
               *)(ppcVar12 + uVar17)) {
            pp_Var15 = &p_Var19->_M_next;
            pp_Var21 = pp_Var14;
          }
          else {
            *pp_Var14 = p_Var19->_M_next;
            operator_delete(p_Var19,0x20);
            psVar1 = &(pTVar7->symbols_by_name_).
                      super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                      .
                      super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                      .
                      super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                      ._M_element_count;
            *psVar1 = *psVar1 - 1;
            pp_Var15 = pp_Var14;
          }
          p_Var19 = *pp_Var15;
          pp_Var14 = pp_Var15;
        } while (p_Var19 !=
                 (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
                  *)0x0);
        if (pp_Var21 !=
            (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
             **)0x0) {
          p_Var19 = *pp_Var21;
          *pp_Var21 = p_Var19->_M_next;
          operator_delete(p_Var19,0x20);
          psVar1 = &(local_78->symbols_by_name_).
                    super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                    .
                    super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                    .
                    super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                    ._M_element_count;
          *psVar1 = *psVar1 - 1;
        }
      }
LAB_001c94a2:
      uVar17 = uVar17 + 1;
      ppcVar12 = (local_78->symbols_after_checkpoint_).
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      this = local_78;
      pTVar7 = local_78;
    } while (uVar17 < (ulong)((long)(local_78->symbols_after_checkpoint_).
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar12 >> 3)
            );
  }
  pCVar6 = local_80;
  uVar17 = (ulong)local_80[-1].pending_files_before_checkpoint;
  ppcVar12 = (this->files_after_checkpoint_).
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (uVar17 < (ulong)((long)(this->files_after_checkpoint_).
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppcVar12 >> 3)) {
    lVar16 = uVar17 * 8;
    do {
      std::tr1::
      _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
      ::erase((_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
               *)&this->files_by_name_,(key_type *)((long)ppcVar12 + lVar16));
      uVar17 = uVar17 + 1;
      ppcVar12 = (this->files_after_checkpoint_).
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 8;
    } while (uVar17 < (ulong)((long)(this->files_after_checkpoint_).
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar12 >> 3)
            );
  }
  uVar17 = (ulong)pCVar6[-1].pending_extensions_before_checkpoint;
  local_70 = &this->extensions_after_checkpoint_;
  ppVar13 = (this->extensions_after_checkpoint_).
            super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (uVar17 < (ulong)((long)(this->extensions_after_checkpoint_).
                             super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar13 >> 4)) {
    lVar16 = uVar17 << 4;
    do {
      pVar22 = std::
               _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
               ::equal_range(&(this->extensions_)._M_t,(key_type *)((long)&ppVar13->first + lVar16))
      ;
      std::
      _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
      ::_M_erase_aux(&(this->extensions_)._M_t,(_Base_ptr)pVar22.first._M_node,
                     (_Base_ptr)pVar22.second._M_node);
      uVar17 = uVar17 + 1;
      ppVar13 = (this->extensions_after_checkpoint_).
                super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x10;
    } while (uVar17 < (ulong)((long)(this->extensions_after_checkpoint_).
                                    super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar13 >> 4)
            );
  }
  pCVar6 = local_80;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&this->symbols_after_checkpoint_,(long)local_80[-1].pending_symbols_before_checkpoint);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&this->files_after_checkpoint_,(long)pCVar6[-1].pending_files_before_checkpoint);
  std::
  vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ::resize(local_70,(long)pCVar6[-1].pending_extensions_before_checkpoint);
  STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<std::__cxx11::string**,std::vector<std::__cxx11::string*,std::allocator<std::__cxx11::string*>>>>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_**,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
              )((this->strings_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start + pCVar6[-1].strings_before_checkpoint),
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_**,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
              )(this->strings_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  ppMVar4 = (this->messages_).
            super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppMVar20 = (this->messages_).
                  super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
                  ._M_impl.super__Vector_impl_data._M_start + pCVar6[-1].messages_before_checkpoint;
      ppMVar20 != ppMVar4; ppMVar20 = ppMVar20 + 1) {
    if (*ppMVar20 != (Message *)0x0) {
      (*((*ppMVar20)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptorTables**,std::vector<google::protobuf::FileDescriptorTables*,std::allocator<google::protobuf::FileDescriptorTables*>>>>
            ((__normal_iterator<google::protobuf::FileDescriptorTables_**,_std::vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>_>
              )((this->file_tables_).
                super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
                ._M_impl.super__Vector_impl_data._M_start + pCVar6[-1].file_tables_before_checkpoint
               ),(__normal_iterator<google::protobuf::FileDescriptorTables_**,_std::vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>_>
                  )(this->file_tables_).
                   super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
  for (uVar17 = (ulong)pCVar6[-1].allocations_before_checkpoint; pCVar6 = local_80,
      ppvVar5 = (this->allocations_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar17 < (ulong)((long)(this->allocations_).
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)ppvVar5 >> 3);
      uVar17 = uVar17 + 1) {
    operator_delete(ppvVar5[uVar17]);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::resize(&this->strings_,(long)local_80[-1].strings_before_checkpoint);
  std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::resize
            (&this->messages_,(long)pCVar6[-1].messages_before_checkpoint);
  std::
  vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
  ::resize(&this->file_tables_,(long)pCVar6[-1].file_tables_before_checkpoint);
  std::vector<void_*,_std::allocator<void_*>_>::resize
            (&this->allocations_,(long)pCVar6[-1].allocations_before_checkpoint);
  ppCVar2 = &(this->checkpoints_).
             super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppCVar2 = *ppCVar2 + -1;
  return;
}

Assistant:

void DescriptorPool::Tables::RollbackToLastCheckpoint() {
  GOOGLE_DCHECK(!checkpoints_.empty());
  const CheckPoint& checkpoint = checkpoints_.back();

  for (int i = checkpoint.pending_symbols_before_checkpoint;
       i < symbols_after_checkpoint_.size();
       i++) {
    symbols_by_name_.erase(symbols_after_checkpoint_[i]);
  }
  for (int i = checkpoint.pending_files_before_checkpoint;
       i < files_after_checkpoint_.size();
       i++) {
    files_by_name_.erase(files_after_checkpoint_[i]);
  }
  for (int i = checkpoint.pending_extensions_before_checkpoint;
       i < extensions_after_checkpoint_.size();
       i++) {
    extensions_.erase(extensions_after_checkpoint_[i]);
  }

  symbols_after_checkpoint_.resize(
      checkpoint.pending_symbols_before_checkpoint);
  files_after_checkpoint_.resize(checkpoint.pending_files_before_checkpoint);
  extensions_after_checkpoint_.resize(
      checkpoint.pending_extensions_before_checkpoint);

  STLDeleteContainerPointers(
      strings_.begin() + checkpoint.strings_before_checkpoint, strings_.end());
  STLDeleteContainerPointers(
      messages_.begin() + checkpoint.messages_before_checkpoint,
      messages_.end());
  STLDeleteContainerPointers(
      file_tables_.begin() + checkpoint.file_tables_before_checkpoint,
      file_tables_.end());
  for (int i = checkpoint.allocations_before_checkpoint;
       i < allocations_.size();
       i++) {
    operator delete(allocations_[i]);
  }

  strings_.resize(checkpoint.strings_before_checkpoint);
  messages_.resize(checkpoint.messages_before_checkpoint);
  file_tables_.resize(checkpoint.file_tables_before_checkpoint);
  allocations_.resize(checkpoint.allocations_before_checkpoint);
  checkpoints_.pop_back();
}